

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O2

void __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::processStack(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
               *this,uint newPixelGreyLevel,
              vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
              *regionStack,RegionAllocator<RegionDetector::Region> *regionAllocator)

{
  Region *other;
  Region *this_00;
  uint __line;
  pointer ppRVar1;
  char *__assertion;
  Region *local_30;
  
  ppRVar1 = (regionStack->
            super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  other = ppRVar1[-1];
  ppRVar1 = ppRVar1 + -1;
  (regionStack->
  super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = ppRVar1;
  do {
    if ((regionStack->
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>).
        _M_impl.super__Vector_impl_data._M_start == ppRVar1) {
      __assertion = "!regionStack.empty()";
      __line = 0x35;
LAB_0015f350:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                    ,__line,
                    "void RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::processStack(unsigned int, std::vector<REGION_TYPE *> &, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    if (newPixelGreyLevel < ppRVar1[-1]->level) {
      local_30 = RegionAllocator<RegionDetector::Region>::new_(regionAllocator,newPixelGreyLevel);
      std::vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>>::
      emplace_back<RegionDetector::Region*>
                ((vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>> *)
                 regionStack,&local_30);
      this_00 = (regionStack->
                super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                )._M_impl.super__Vector_impl_data._M_finish[-1];
      if (this_00 != (Region *)0x0) {
        Region::merge(this_00,other);
        return;
      }
      __assertion = "regionStack.back()";
      __line = 0x39;
      goto LAB_0015f350;
    }
    Region::merge(ppRVar1[-1],other);
    ppRVar1 = (regionStack->
              super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (newPixelGreyLevel <= ppRVar1[-1]->level) {
      return;
    }
  } while( true );
}

Assistant:

void processStack(unsigned int newPixelGreyLevel, std::vector<REGION_TYPE*> &regionStack, REGION_ALLOCATOR_TYPE *regionAllocator) {

			Region *first = regionStack.back();
			regionStack.pop_back();

			do {
				assert(!regionStack.empty());
				if (newPixelGreyLevel < regionStack.back()->level) {

					regionStack.push_back(regionAllocator->new_(newPixelGreyLevel));
					assert(regionStack.back());
					regionStack.back()->merge(first);

					return;
				}

				assert(!regionStack.empty());
				regionStack.back()->merge(first);

			} while (newPixelGreyLevel > regionStack.back()->level);
		}